

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall spirv_cross::Compiler::parse_fixup(Compiler *this)

{
  bool bVar1;
  uint32_t uVar2;
  Types TVar3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  Variant *this_01;
  SPIRConstant *this_02;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *this_03;
  uint32_t local_78;
  uint32_t local_74;
  SPIRVariable *local_70;
  SPIRVariable *var;
  pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint> *entry;
  iterator __end4;
  iterator __begin4;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
  *__range4;
  SPIRConstant *c;
  Variant *id;
  TypedID<(spirv_cross::Types)0> *pTStack_28;
  TypedID<(spirv_cross::Types)0> id_;
  TypedID<(spirv_cross::Types)0> *__end1;
  TypedID<(spirv_cross::Types)0> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *__range1;
  Compiler *this_local;
  
  this_00 = &(this->ir).ids_for_constant_or_variable;
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::begin
                     (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  pTStack_28 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::end
                         (&this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  for (; __end1 != pTStack_28; __end1 = __end1 + 1) {
    id._4_4_ = __end1->id;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&id + 4));
    this_01 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->ir).ids.super_VectorView<spirv_cross::Variant>,(ulong)uVar2);
    TVar3 = Variant::get_type(this_01);
    if (TVar3 == TypeConstant) {
      this_02 = Variant::get<spirv_cross::SPIRConstant>(this_01);
      bVar1 = has_decoration(this,(ID)(this_02->super_IVariant).self.id,DecorationBuiltIn);
      if ((bVar1) &&
         (uVar2 = get_decoration(this,(ID)(this_02->super_IVariant).self.id,DecorationBuiltIn),
         uVar2 == 0x19)) {
        this_03 = &(this->ir).entry_points;
        __end4 = ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
                 ::begin(this_03);
        entry = (pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>
                 *)::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>_>
                   ::end(this_03);
        while (bVar1 = ::std::__detail::operator!=
                                 (&__end4.
                                   super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                                  ,(_Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
                                    *)&entry), bVar1) {
          var = (SPIRVariable *)
                ::std::__detail::
                _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
                ::operator*(&__end4);
          uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(this_02->super_IVariant).self)
          ;
          *(uint32_t *)&var[1].dereference_chain.buffer_capacity = uVar2;
          uVar2 = SPIRConstant::scalar(this_02,0,0);
          var[1].initializer.id = uVar2;
          uVar2 = SPIRConstant::scalar(this_02,0,1);
          var[1].basevariable.id = uVar2;
          uVar2 = SPIRConstant::scalar(this_02,0,2);
          *(uint32_t *)&var[1].dereference_chain.super_VectorView<unsigned_int>.ptr = uVar2;
          ::std::__detail::
          _Node_iterator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_false,_true>
          ::operator++(&__end4);
        }
      }
    }
    else {
      TVar3 = Variant::get_type(this_01);
      if (TVar3 == TypeVariable) {
        local_70 = Variant::get<spirv_cross::SPIRVariable>(this_01);
        if ((((local_70->storage == StorageClassPrivate) ||
             (local_70->storage == StorageClassWorkgroup)) ||
            (local_70->storage == StorageClassTaskPayloadWorkgroupEXT)) ||
           (local_70->storage == StorageClassOutput)) {
          local_74 = TypedID::operator_cast_to_unsigned_int
                               ((TypedID *)&(local_70->super_IVariant).self);
          SmallVector<unsigned_int,_8UL>::push_back(&this->global_variables,&local_74);
        }
        bVar1 = variable_storage_is_aliased(this,local_70);
        if (bVar1) {
          local_78 = TypedID::operator_cast_to_unsigned_int
                               ((TypedID *)&(local_70->super_IVariant).self);
          SmallVector<unsigned_int,_8UL>::push_back(&this->aliased_variables,&local_78);
        }
      }
    }
  }
  return;
}

Assistant:

void Compiler::parse_fixup()
{
	// Figure out specialization constants for work group sizes.
	for (auto id_ : ir.ids_for_constant_or_variable)
	{
		auto &id = ir.ids[id_];

		if (id.get_type() == TypeConstant)
		{
			auto &c = id.get<SPIRConstant>();
			if (has_decoration(c.self, DecorationBuiltIn) &&
			    BuiltIn(get_decoration(c.self, DecorationBuiltIn)) == BuiltInWorkgroupSize)
			{
				// In current SPIR-V, there can be just one constant like this.
				// All entry points will receive the constant value.
				// WorkgroupSize take precedence over LocalSizeId.
				for (auto &entry : ir.entry_points)
				{
					entry.second.workgroup_size.constant = c.self;
					entry.second.workgroup_size.x = c.scalar(0, 0);
					entry.second.workgroup_size.y = c.scalar(0, 1);
					entry.second.workgroup_size.z = c.scalar(0, 2);
				}
			}
		}
		else if (id.get_type() == TypeVariable)
		{
			auto &var = id.get<SPIRVariable>();
			if (var.storage == StorageClassPrivate || var.storage == StorageClassWorkgroup ||
			    var.storage == StorageClassTaskPayloadWorkgroupEXT ||
			    var.storage == StorageClassOutput)
			{
				global_variables.push_back(var.self);
			}
			if (variable_storage_is_aliased(var))
				aliased_variables.push_back(var.self);
		}
	}
}